

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::readPixelsGLES2(Functions *gl,Surface *dst)

{
  glReadPixelsFunc p_Var1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  PixelBufferAccess local_40;
  Surface *local_18;
  Surface *dst_local;
  Functions *gl_local;
  
  p_Var1 = gl->readPixels;
  local_18 = dst;
  dst_local = (Surface *)gl;
  iVar2 = tcu::Surface::getWidth(dst);
  iVar3 = tcu::Surface::getHeight(local_18);
  tcu::Surface::getAccess(&local_40,local_18);
  pvVar4 = tcu::PixelBufferAccess::getDataPtr(&local_40);
  (*p_Var1)(0,0,iVar2,iVar3,0x1908,0x1401,pvVar4);
  return;
}

Assistant:

static void readPixelsGLES2 (const glw::Functions& gl, tcu::Surface& dst)
{
	gl.readPixels(0, 0, dst.getWidth(), dst.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}